

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O3

void put_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  J_COLOR_SPACE JVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  JDIMENSION JVar9;
  JSAMPARRAY *pppJVar10;
  long lVar11;
  JSAMPROW __src;
  ulong uVar12;
  JSAMPARRAY __dest;
  double dVar13;
  
  if (*(int *)&dinfo[1].output_file == 0) {
    pppJVar10 = &dinfo[1].buffer;
  }
  else {
    pppJVar10 = (JSAMPARRAY *)
                (*cinfo->mem->access_virt_sarray)
                          ((j_common_ptr)cinfo,(jvirt_sarray_ptr)dinfo[1].put_pixel_rows,
                           *(JDIMENSION *)((long)&dinfo[1].calc_buffer_dimensions + 4),1,1);
    piVar1 = (int *)((long)&dinfo[1].calc_buffer_dimensions + 4);
    *piVar1 = *piVar1 + 1;
  }
  __dest = *pppJVar10;
  __src = *dinfo->buffer;
  JVar4 = cinfo->out_color_space;
  uVar12 = (ulong)JVar4;
  if (uVar12 == 4) {
    JVar9 = cinfo->output_width;
    if (JVar9 != 0) {
      lVar11 = 0;
      do {
        bVar2 = __src[lVar11 * 4 + 1];
        bVar3 = __src[lVar11 * 4 + 2];
        dVar13 = (double)__src[lVar11 * 4 + 3];
        *(JSAMPLE *)((long)__dest + 2) =
             (JSAMPLE)(int)(((double)__src[lVar11 * 4] * dVar13) / 255.0 + 0.5);
        *(JSAMPLE *)((long)__dest + 1) = (JSAMPLE)(int)(((double)bVar2 * dVar13) / 255.0 + 0.5);
        *(JSAMPLE *)__dest = (JSAMPLE)(int)(((double)bVar3 * dVar13) / 255.0 + 0.5);
        __dest = (JSAMPARRAY)((long)__dest + 3);
        lVar11 = lVar11 + 1;
      } while (JVar9 != (JDIMENSION)lVar11);
    }
  }
  else if (JVar4 == JCS_RGB565) {
    JVar9 = cinfo->output_width;
    if (JVar9 != 0) {
      lVar11 = 0;
      do {
        *(JSAMPLE *)__dest = __src[lVar11 * 2] << 3;
        *(byte *)((long)__dest + 1) = (byte)(*(ushort *)(__src + lVar11 * 2) >> 3) & 0xfc;
        *(byte *)((long)__dest + 2) = __src[lVar11 * 2 + 1] & 0xf8;
        __dest = (JSAMPARRAY)((long)__dest + 3);
        lVar11 = lVar11 + 1;
      } while (JVar9 != (JDIMENSION)lVar11);
    }
  }
  else if (JVar4 == JCS_EXT_BGR) {
    memcpy(__dest,__src,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4));
    __dest = (JSAMPARRAY)((long)__dest + (ulong)(cinfo->output_width * 3));
  }
  else {
    JVar9 = cinfo->output_width;
    if (JVar9 != 0) {
      iVar5 = rgb_pixelsize[uVar12];
      iVar6 = rgb_blue[uVar12];
      iVar7 = rgb_green[uVar12];
      iVar8 = rgb_red[uVar12];
      do {
        *(JSAMPLE *)__dest = __src[iVar6];
        *(JSAMPLE *)((long)__dest + 1) = __src[iVar7];
        *(JSAMPLE *)((long)__dest + 2) = __src[iVar8];
        __dest = (JSAMPARRAY)((long)__dest + 3);
        __src = __src + iVar5;
        JVar9 = JVar9 - 1;
      } while (JVar9 != 0);
    }
  }
  if (0 < (long)*(int *)&dinfo[1].calc_buffer_dimensions) {
    memset(__dest,0,(long)*(int *)&dinfo[1].calc_buffer_dimensions);
  }
  if (*(int *)&dinfo[1].output_file == 0) {
    fwrite(dinfo[1].buffer,1,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4),
           (FILE *)dinfo->output_file);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
put_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
               JDIMENSION rows_supplied)
/* used for unquantized full-color output */
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;
  register JDIMENSION col;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    outptr[0] = inptr[2]; /* RGB to BGR order */
    outptr[1] = inptr[1];
    outptr[2] = inptr[0];
    inptr += 3, outptr += 3;
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}